

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECUPort.cc
# Opt level: O0

Bytes * __thiscall
SSM::ECUPort::buildReadRequest
          (Bytes *__return_storage_ptr__,ECUPort *this,Observables *observables,bool continuous)

{
  initializer_list<std::byte> __l;
  bool bVar1;
  size_type sVar2;
  Byte local_111;
  byte *local_110;
  byte *local_108;
  __normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_> local_100;
  __normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_> local_f8;
  const_iterator local_f0;
  allocator<std::byte> local_e7;
  byte local_e6 [4];
  undefined1 local_e2;
  byte local_e1;
  iterator local_e0;
  size_type local_d8;
  undefined1 local_c9;
  const_iterator local_c8;
  value_type *addr_byte;
  const_iterator __end3;
  const_iterator __begin3;
  array<std::byte,_3UL> *__range3;
  array<std::byte,_3UL> *addr;
  iterator __end2;
  iterator __begin2;
  vector<std::array<std::byte,_3UL>,_std::allocator<std::array<std::byte,_3UL>_>_> local_80 [24];
  vector<std::array<std::byte,_3UL>,_std::allocator<std::array<std::byte,_3UL>_>_> *local_68;
  vector<std::array<std::byte,_3UL>,_std::allocator<std::array<std::byte,_3UL>_>_> *__range2;
  Observable **obs;
  const_iterator __end1;
  const_iterator __begin1;
  Observables *__range1;
  Bytes addresses;
  bool continuous_local;
  Observables *observables_local;
  ECUPort *this_local;
  Bytes *request;
  
  addresses.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = continuous;
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)&__range1);
  __end1 = std::vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>::begin
                     (observables);
  obs = (Observable **)
        std::vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>::end
                  (observables);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_SSM::Observable_*const_*,_std::vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>_>
                                     *)&obs), bVar1) {
    __range2 = (vector<std::array<std::byte,_3UL>,_std::allocator<std::array<std::byte,_3UL>_>_> *)
               __gnu_cxx::
               __normal_iterator<const_SSM::Observable_*const_*,_std::vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>_>
               ::operator*(&__end1);
    (**(code **)(*(long *)*(Observable **)__range2 + 0x10))(local_80);
    local_68 = local_80;
    __end2 = std::vector<std::array<std::byte,_3UL>,_std::allocator<std::array<std::byte,_3UL>_>_>::
             begin(local_68);
    addr = (array<std::byte,_3UL> *)
           std::vector<std::array<std::byte,_3UL>,_std::allocator<std::array<std::byte,_3UL>_>_>::
           end(local_68);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::array<std::byte,_3UL>_*,_std::vector<std::array<std::byte,_3UL>,_std::allocator<std::array<std::byte,_3UL>_>_>_>
                                       *)&addr), bVar1) {
      __begin3 = __gnu_cxx::
                 __normal_iterator<std::array<std::byte,_3UL>_*,_std::vector<std::array<std::byte,_3UL>,_std::allocator<std::array<std::byte,_3UL>_>_>_>
                 ::operator*(&__end2)->_M_elems;
      __range3 = (array<std::byte,_3UL> *)__begin3;
      __end3 = std::array<std::byte,_3UL>::begin((array<std::byte,_3UL> *)__begin3);
      addr_byte = std::array<std::byte,_3UL>::end((array<std::byte,_3UL> *)__begin3);
      for (; __end3 != addr_byte; __end3 = __end3 + 1) {
        local_c8 = __end3;
        std::vector<std::byte,_std::allocator<std::byte>_>::push_back
                  ((vector<std::byte,_std::allocator<std::byte>_> *)&__range1,__end3);
      }
      __gnu_cxx::
      __normal_iterator<std::array<std::byte,_3UL>_*,_std::vector<std::array<std::byte,_3UL>,_std::allocator<std::array<std::byte,_3UL>_>_>_>
      ::operator++(&__end2);
    }
    std::vector<std::array<std::byte,_3UL>,_std::allocator<std::array<std::byte,_3UL>_>_>::~vector
              (local_80);
    __gnu_cxx::
    __normal_iterator<const_SSM::Observable_*const_*,_std::vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>_>
    ::operator++(&__end1);
  }
  local_c9 = 0;
  local_e6[0] = 0x80;
  local_e6[1] = 0x10;
  local_e6[2] = 0xf0;
  sVar2 = std::vector<std::byte,_std::allocator<std::byte>_>::size
                    ((vector<std::byte,_std::allocator<std::byte>_> *)&__range1);
  local_e6[3] = (char)sVar2 + '\x02';
  local_e2 = 0xa8;
  local_e1 = addresses.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._7_1_ & 1;
  local_e0 = local_e6;
  local_d8 = 6;
  std::allocator<std::byte>::allocator(&local_e7);
  __l._M_len = local_d8;
  __l._M_array = local_e0;
  std::vector<std::byte,_std::allocator<std::byte>_>::vector(__return_storage_ptr__,__l,&local_e7);
  std::allocator<std::byte>::~allocator(&local_e7);
  local_f8._M_current =
       (byte *)std::vector<std::byte,_std::allocator<std::byte>_>::end(__return_storage_ptr__);
  __gnu_cxx::__normal_iterator<std::byte_const*,std::vector<std::byte,std::allocator<std::byte>>>::
  __normal_iterator<std::byte*>
            ((__normal_iterator<std::byte_const*,std::vector<std::byte,std::allocator<std::byte>>> *
             )&local_f0,&local_f8);
  local_100._M_current =
       (byte *)std::vector<std::byte,_std::allocator<std::byte>_>::begin
                         ((vector<std::byte,_std::allocator<std::byte>_> *)&__range1);
  local_108 = (byte *)std::vector<std::byte,_std::allocator<std::byte>_>::end
                                ((vector<std::byte,_std::allocator<std::byte>_> *)&__range1);
  local_110 = (byte *)std::vector<std::byte,std::allocator<std::byte>>::
                      insert<__gnu_cxx::__normal_iterator<std::byte*,std::vector<std::byte,std::allocator<std::byte>>>,void>
                                ((vector<std::byte,std::allocator<std::byte>> *)
                                 __return_storage_ptr__,local_f0,local_100,
                                 (__normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
                                  )local_108);
  local_111 = checksum(this,__return_storage_ptr__);
  std::vector<std::byte,_std::allocator<std::byte>_>::push_back(__return_storage_ptr__,&local_111);
  local_c9 = 1;
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

Bytes ECUPort::buildReadRequest(const Observables& observables,
				  bool continuous) const
  {
    // Add all read addresses to a byte vector
    Bytes addresses;
    for(const auto& obs : observables)
      for(const auto& addr: obs->addresses())
	for(const auto& addr_byte: addr)
	  addresses.push_back(addr_byte);
    
    // Build the header of read request. Datasize is number of
    // addresses plus 2 since READ and CONTIN_RESP/SINGLE_RESP bytes
    // are to be included (not the checksum byte though)
    Bytes request = { HEADER, ECU, TOOL, Byte(addresses.size()+2), READ,
		      (continuous ? CONTIN_RESP : SINGLE_RESP) };
    
    // Attach the addresses to read
    request.insert(request.end(), addresses.begin(), addresses.end());

    // Add the checksum byte and return
    request.push_back(checksum(request));
    return request;
  }